

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linalg.cc
# Opt level: O3

void gmath::svd(Matrixd *a,Matrixd *U,Vectord *W,Matrixd *V,bool thin)

{
  EVP_PKEY_CTX *pEVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  uint uVar7;
  undefined1 auVar8 [16];
  uint uVar9;
  EVP_PKEY_CTX *pEVar10;
  double *pdVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  double *pdVar17;
  double *pdVar18;
  int iVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  uint uVar23;
  uint uVar24;
  ulong uVar25;
  EVP_PKEY_CTX *pEVar26;
  long lVar27;
  double *pdVar28;
  long lVar29;
  ulong uVar30;
  int iVar31;
  undefined7 in_register_00000081;
  long lVar32;
  double *pdVar33;
  double *pdVar34;
  EVP_PKEY_CTX *pEVar35;
  double *pdVar36;
  double *pdVar37;
  uint uVar38;
  double *pdVar39;
  undefined1 (*pauVar40) [16];
  ulong uVar41;
  double *pdVar42;
  undefined1 (*pauVar43) [16];
  int iVar44;
  ulong uVar45;
  ulong uVar46;
  EVP_PKEY_CTX *pEVar47;
  int iVar48;
  undefined1 (*pauVar49) [16];
  uint uVar50;
  ulong uVar51;
  int iVar55;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  double dVar56;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  double dVar63;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  double dVar71;
  int iVar73;
  double dVar72;
  double dVar74;
  Matrixd A;
  Vectord e;
  Vectord work;
  long local_150;
  double *local_148;
  long local_140;
  long local_130;
  double *local_128;
  long local_100;
  DMatrix<double> local_c8;
  ulong local_b0;
  ulong local_a8;
  DVector<double> local_a0;
  int local_90;
  int local_8c;
  long local_88;
  DVector<double> local_80;
  ulong local_70;
  ulong local_68;
  double *local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  ulong local_38;
  
  DMatrix<double>::DMatrix(&local_c8,a);
  iVar4 = local_c8.ncols;
  uVar51 = (ulong)(uint)local_c8.nrows;
  pEVar10 = (EVP_PKEY_CTX *)(long)local_c8.ncols;
  uVar45 = uVar51;
  if (local_c8.ncols < local_c8.nrows) {
    uVar45 = (ulong)(uint)local_c8.ncols;
  }
  if ((int)CONCAT71(in_register_00000081,thin) == 0) {
    uVar45 = (ulong)(uint)local_c8.nrows;
  }
  DMatrix<double>::init(U,(EVP_PKEY_CTX *)(ulong)(uint)local_c8.nrows);
  uVar25 = (ulong)(uint)iVar4;
  if (0 < (long)U->n) {
    memset(U->v,0,(long)U->n << 3);
  }
  uVar7 = local_c8.nrows + 1U;
  if (iVar4 < (int)(local_c8.nrows + 1U)) {
    uVar7 = iVar4;
  }
  pEVar26 = (EVP_PKEY_CTX *)(ulong)uVar7;
  DVector<double>::init(W,pEVar26);
  DMatrix<double>::init(V,(EVP_PKEY_CTX *)(ulong)(uint)iVar4);
  if (0 < (long)V->n) {
    memset(V->v,0,(long)V->n << 3);
  }
  local_a0.n = 0;
  local_a0.v = (double *)0x0;
  DVector<double>::init(&local_a0,pEVar10);
  local_80.n = 0;
  local_80.v = (double *)0x0;
  local_68 = uVar45;
  DVector<double>::init(&local_80,(EVP_PKEY_CTX *)(ulong)(uint)local_c8.nrows);
  pdVar37 = local_a0.v;
  pdVar28 = local_c8.v;
  lVar14 = (long)local_c8.nrows;
  uVar45 = lVar14 - 1;
  uVar9 = (uint)uVar45;
  uVar30 = uVar45 & 0xffffffff;
  if (iVar4 < (int)uVar9) {
    uVar30 = (ulong)(uint)iVar4;
  }
  uVar50 = iVar4 - 2U;
  if (local_c8.nrows < (int)(iVar4 - 2U)) {
    uVar50 = local_c8.nrows;
  }
  local_70 = 0;
  if (0 < (int)uVar50) {
    local_70 = (ulong)uVar50;
  }
  iVar31 = (int)uVar30;
  uVar16 = local_70;
  if ((int)local_70 < iVar31) {
    uVar16 = uVar30;
  }
  lVar20 = (long)iVar31;
  local_88 = (long)(int)uVar50;
  local_a8 = uVar51;
  if ((int)uVar16 != 0) {
    pdVar11 = W->v;
    lVar29 = (long)local_c8.ncols;
    local_90 = local_c8.ncols + 1;
    pdVar36 = U->v;
    lVar15 = (long)V->ncols;
    local_8c = local_c8.nrows - 2;
    local_60 = local_80.v + 1;
    local_40 = (long)U->ncols * 8 + 8;
    local_b0 = (long)U->ncols << 3;
    pdVar42 = V->v + lVar15;
    local_48 = lVar15 * 8 + 8;
    local_50 = lVar29 * 8 + 8;
    local_148 = (double *)0x1;
    local_100 = 8;
    local_130 = 0;
    uVar30 = 0;
    pdVar34 = local_c8.v;
    pdVar18 = local_a0.v;
    uVar46 = uVar25;
    local_58 = lVar29;
    local_38 = uVar16;
    do {
      iVar48 = (int)uVar30;
      if ((long)uVar30 < lVar20) {
        pdVar11[uVar30] = 0.0;
        dVar56 = 0.0;
        uVar16 = uVar51;
        pdVar39 = pdVar34;
        do {
          if ((dVar56 != 0.0) || (NAN(dVar56))) {
            dVar72 = *pdVar39 / dVar56;
            dVar56 = ABS(dVar56) * SQRT(dVar72 * dVar72 + 1.0);
          }
          else {
            dVar56 = ABS(*pdVar39);
          }
          pdVar11[uVar30] = dVar56;
          pdVar39 = pdVar39 + lVar29;
          uVar16 = uVar16 - 1;
        } while (uVar16 != 0);
        if ((dVar56 != 0.0) || (NAN(dVar56))) {
          iVar12 = local_90 * iVar48;
          uVar16 = uVar51;
          pdVar39 = pdVar34;
          if (pdVar28[iVar12] <= 0.0 && pdVar28[iVar12] != 0.0) {
            pdVar11[uVar30] = -dVar56;
          }
          do {
            *pdVar39 = *pdVar39 / pdVar11[uVar30];
            pdVar39 = pdVar39 + lVar29;
            uVar16 = uVar16 - 1;
          } while (uVar16 != 0);
          pdVar28[iVar12] = pdVar28[iVar12] + 1.0;
          dVar56 = pdVar11[uVar30];
        }
        pdVar11[uVar30] = -dVar56;
      }
      uVar16 = uVar30 + 1;
      if ((long)uVar16 < (long)pEVar10) {
        lVar21 = (long)local_c8.ncols;
        lVar32 = local_130 * lVar21 + local_100;
        lVar22 = (lVar21 + 1) * local_130;
        pdVar39 = local_148;
        do {
          if (((long)uVar30 < lVar20) && ((pdVar11[uVar30] != 0.0 || (NAN(pdVar11[uVar30]))))) {
            dVar56 = 0.0;
            pdVar17 = local_c8.v;
            uVar41 = uVar51;
            do {
              dVar56 = dVar56 + *(double *)((long)pdVar17 + lVar22) *
                                *(double *)((long)pdVar17 + lVar32);
              pdVar17 = pdVar17 + lVar21;
              uVar41 = uVar41 - 1;
            } while (uVar41 != 0);
            dVar72 = local_c8.v[(int)(iVar48 * (local_c8.ncols + 1U))];
            uVar41 = uVar51;
            pdVar17 = local_c8.v;
            do {
              *(double *)((long)pdVar17 + lVar32) =
                   *(double *)((long)pdVar17 + lVar22) * (-dVar56 / dVar72) +
                   *(double *)((long)pdVar17 + lVar32);
              pdVar17 = pdVar17 + lVar21;
              uVar41 = uVar41 - 1;
            } while (uVar41 != 0);
          }
          pdVar37[(long)pdVar39] = pdVar28[uVar30 * local_58 + (long)pdVar39];
          pdVar39 = (double *)((long)pdVar39 + 1);
          lVar32 = lVar32 + 8;
        } while (pdVar39 != (double *)uVar25);
      }
      uVar41 = uVar51;
      pdVar39 = pdVar36;
      pdVar17 = pdVar34;
      if ((long)uVar30 < lVar20) {
        do {
          *pdVar39 = *pdVar17;
          pdVar17 = pdVar17 + lVar29;
          pdVar39 = (double *)((long)pdVar39 + local_b0);
          uVar41 = uVar41 - 1;
        } while (uVar41 != 0);
      }
      if ((long)uVar30 < local_88) {
        pdVar37[uVar30] = 0.0;
        dVar56 = 0.0;
        uVar41 = 1;
        do {
          if ((dVar56 != 0.0) || (NAN(dVar56))) {
            dVar72 = pdVar18[uVar41] / dVar56;
            dVar56 = ABS(dVar56) * SQRT(dVar72 * dVar72 + 1.0);
          }
          else {
            dVar56 = ABS(pdVar18[uVar41]);
          }
          pdVar37[uVar30] = dVar56;
          uVar41 = uVar41 + 1;
        } while (uVar46 != uVar41);
        if ((dVar56 != 0.0) || (NAN(dVar56))) {
          if (pdVar37[uVar16] <= 0.0 && pdVar37[uVar16] != 0.0) {
            pdVar37[uVar30] = -dVar56;
          }
          uVar41 = 1;
          do {
            pdVar18[uVar41] = pdVar18[uVar41] / pdVar37[uVar30];
            uVar41 = uVar41 + 1;
          } while (uVar46 != uVar41);
          dVar56 = pdVar37[uVar30];
          pdVar37[uVar16] = pdVar37[uVar16] + 1.0;
        }
        pdVar37[uVar30] = -dVar56;
        if (((long)uVar16 < lVar14) && ((dVar56 != 0.0 || (NAN(dVar56))))) {
          memset(local_60 + uVar30,0,(ulong)(uint)(local_8c - iVar48) * 8 + 8);
          pdVar17 = (double *)(((long)local_c8.ncols + 1) * local_100 + (long)local_c8.v);
          pdVar39 = local_148;
          do {
            uVar30 = 1;
            pdVar33 = pdVar17;
            do {
              *(double *)((long)local_80.v + uVar30 * 8 + local_130) =
                   pdVar37[(long)pdVar39] * *pdVar33 +
                   *(double *)((long)local_80.v + uVar30 * 8 + local_130);
              pdVar33 = pdVar33 + local_c8.ncols;
              uVar30 = uVar30 + 1;
            } while (uVar51 != uVar30);
            pdVar39 = (double *)((long)pdVar39 + 1);
            pdVar17 = pdVar17 + 1;
          } while (pdVar39 != (double *)uVar25);
          pdVar17 = (double *)(((long)local_c8.ncols + 1) * local_100 + (long)local_c8.v);
          pdVar39 = local_148;
          do {
            dVar56 = pdVar37[(long)pdVar39];
            dVar72 = pdVar37[uVar16];
            uVar30 = 1;
            pdVar33 = pdVar17;
            do {
              *pdVar33 = *(double *)((long)local_80.v + uVar30 * 8 + local_130) * (-dVar56 / dVar72)
                         + *pdVar33;
              pdVar33 = pdVar33 + local_c8.ncols;
              uVar30 = uVar30 + 1;
            } while (uVar51 != uVar30);
            pdVar39 = (double *)((long)pdVar39 + 1);
            pdVar17 = pdVar17 + 1;
          } while (pdVar39 != (double *)uVar25);
        }
        uVar30 = 1;
        pdVar39 = pdVar42;
        do {
          *pdVar39 = pdVar18[uVar30];
          pdVar39 = pdVar39 + lVar15;
          uVar30 = uVar30 + 1;
        } while (uVar46 != uVar30);
      }
      local_148 = (double *)((long)local_148 + 1);
      pdVar34 = (double *)((long)pdVar34 + local_50);
      uVar51 = uVar51 - 1;
      local_100 = local_100 + 8;
      local_130 = local_130 + 8;
      pdVar36 = (double *)((long)pdVar36 + local_40);
      pdVar18 = pdVar18 + 1;
      uVar46 = uVar46 - 1;
      pdVar42 = (double *)((long)pdVar42 + local_48);
      uVar30 = uVar16;
    } while (uVar16 != local_38);
  }
  iVar48 = (int)local_a8;
  if (iVar48 <= iVar4) {
    W->v[lVar20] = local_c8.v[(int)((local_c8.ncols + 1U) * iVar31)];
  }
  if (local_c8.nrows < iVar4) {
    W->v[(long)(int)uVar7 + -1] = 0.0;
  }
  iVar12 = uVar7 - 1;
  if ((int)local_70 + 1 < (int)uVar7) {
    local_a0.v[local_70 & 0xffffffff] = local_c8.v[(int)local_70 * local_c8.ncols + iVar12];
  }
  local_a0.v[iVar12] = 0.0;
  auVar68 = _DAT_0011f0b0;
  auVar8 = _DAT_0011f0a0;
  iVar44 = (int)local_68;
  if (iVar31 < iVar44) {
    pdVar28 = U->v;
    iVar13 = U->ncols;
    uVar50 = uVar9;
    if (iVar4 < (int)uVar9) {
      uVar50 = iVar4;
    }
    lVar15 = (long)(int)uVar50;
    lVar20 = local_a8 - 1;
    auVar52._8_4_ = (int)lVar20;
    auVar52._0_8_ = lVar20;
    auVar52._12_4_ = (int)((ulong)lVar20 >> 0x20);
    pdVar37 = pdVar28 + lVar15;
    auVar52 = auVar52 ^ _DAT_0011f0b0;
    do {
      pdVar11 = pdVar37;
      uVar51 = (ulong)(iVar48 + 1U & 0xfffffffe);
      auVar53 = auVar8;
      if (0 < iVar48) {
        do {
          bVar5 = auVar52._0_4_ < SUB164(auVar53 ^ auVar68,0);
          iVar55 = auVar52._4_4_;
          iVar19 = SUB164(auVar53 ^ auVar68,4);
          if ((bool)(~(iVar55 < iVar19 || iVar19 == iVar55 && bVar5) & 1)) {
            *pdVar11 = 0.0;
          }
          if (iVar55 >= iVar19 && (iVar19 != iVar55 || !bVar5)) {
            pdVar11[iVar13] = 0.0;
          }
          auVar57._0_8_ = auVar53._0_8_ + 2;
          auVar57._8_8_ = auVar53._8_8_ + 2;
          uVar51 = uVar51 - 2;
          pdVar11 = pdVar11 + (long)iVar13 * 2;
          auVar53 = auVar57;
        } while (uVar51 != 0);
      }
      pdVar28[(iVar13 + 1) * (int)lVar15] = 1.0;
      lVar15 = lVar15 + 1;
      pdVar37 = pdVar37 + 1;
    } while ((iVar44 + uVar50) - iVar31 != (int)lVar15);
  }
  auVar68 = _DAT_0011f0b0;
  auVar8 = _DAT_0011f0a0;
  if (0 < iVar31) {
    pdVar28 = W->v;
    pdVar37 = U->v;
    lVar20 = (long)U->ncols;
    if (iVar4 < (int)uVar9) {
      uVar9 = iVar4;
    }
    iVar13 = U->ncols + 1;
    lVar29 = (long)(int)uVar9;
    uVar50 = iVar31 - 2;
    local_b0 = local_a8 + 1 & 0xfffffffffffffffe;
    lVar15 = local_a8 - 1;
    auVar53._8_4_ = (int)lVar15;
    auVar53._0_8_ = lVar15;
    auVar53._12_4_ = (int)((ulong)lVar15 >> 0x20);
    lVar15 = lVar29 * 8;
    local_128 = (double *)(lVar29 * 8);
    lVar21 = (lVar29 + -1) * lVar20;
    local_148 = pdVar37 + lVar29 + lVar21;
    uVar51 = lVar20 * 8 ^ 0xfffffffffffffff8;
    pdVar36 = pdVar37 + lVar29 + lVar21 + -1;
    iVar31 = iVar48 - uVar9;
    pdVar11 = pdVar37 + lVar29;
    do {
      local_128 = (double *)((long)local_128 + -8);
      iVar31 = iVar31 + 1;
      pdVar11 = pdVar11 + -1;
      iVar55 = (int)(lVar29 + -1);
      if ((pdVar28[lVar29 + -1] != 0.0) ||
         (uVar30 = local_b0, pdVar34 = pdVar11, auVar52 = auVar8, NAN(pdVar28[lVar29 + -1]))) {
        if (lVar29 < iVar44) {
          pdVar34 = U->v;
          lVar22 = (long)U->ncols;
          lVar32 = (long)pdVar34 + (long)local_128 * lVar22 + lVar15;
          pdVar18 = local_148;
          lVar21 = lVar29;
          do {
            if (lVar29 <= lVar14) {
              dVar56 = 0.0;
              lVar27 = 0;
              iVar19 = iVar31;
              do {
                dVar56 = dVar56 + *(double *)
                                   ((long)pdVar34 + lVar27 + (lVar22 + 1) * (long)local_128) *
                                  *(double *)(lVar32 + lVar27);
                lVar27 = lVar27 + lVar22 * 8;
                iVar19 = iVar19 + -1;
              } while (iVar19 != 0);
              if (lVar29 <= lVar14) {
                dVar72 = pdVar37[iVar13 * iVar55];
                lVar27 = 0;
                iVar19 = iVar31;
                do {
                  *(double *)((long)pdVar18 + lVar27) =
                       *(double *)((long)pdVar36 + lVar27) * (-dVar56 / dVar72) +
                       *(double *)((long)pdVar18 + lVar27);
                  lVar27 = lVar27 + lVar20 * 8;
                  iVar19 = iVar19 + -1;
                } while (iVar19 != 0);
              }
            }
            lVar21 = lVar21 + 1;
            lVar32 = lVar32 + 8;
            pdVar18 = pdVar18 + 1;
          } while (lVar21 < iVar44);
        }
        pdVar34 = pdVar36;
        iVar19 = iVar31;
        if (lVar29 <= lVar14) {
          do {
            *pdVar34 = -*pdVar34;
            pdVar34 = pdVar34 + lVar20;
            iVar19 = iVar19 + -1;
          } while (iVar19 != 0);
        }
        pdVar37[iVar13 * iVar55] = pdVar37[iVar13 * iVar55] + 1.0;
        if (2 < lVar29) {
          uVar30 = (ulong)uVar50 + 1 & 0xfffffffffffffffe;
          lVar21 = (ulong)uVar50 - 1;
          auVar64._8_4_ = (int)lVar21;
          auVar64._0_8_ = lVar21;
          auVar64._12_4_ = (int)((ulong)lVar21 >> 0x20);
          pdVar34 = pdVar11;
          auVar67 = auVar8;
          do {
            bVar5 = SUB164(auVar64 ^ auVar68,0) < SUB164(auVar67 ^ auVar68,0);
            iVar55 = SUB164(auVar64 ^ auVar68,4);
            iVar19 = SUB164(auVar67 ^ auVar68,4);
            if ((bool)(~(iVar55 < iVar19 || iVar19 == iVar55 && bVar5) & 1)) {
              *pdVar34 = 0.0;
            }
            if (iVar55 >= iVar19 && (iVar19 != iVar55 || !bVar5)) {
              pdVar34[lVar20] = 0.0;
            }
            lVar21 = auVar67._8_8_;
            auVar67._0_8_ = auVar67._0_8_ + 2;
            auVar67._8_8_ = lVar21 + 2;
            pdVar34 = pdVar34 + lVar20 * 2;
            uVar30 = uVar30 - 2;
          } while (uVar30 != 0);
        }
      }
      else {
        do {
          bVar5 = SUB164(auVar53 ^ auVar68,0) < SUB164(auVar52 ^ auVar68,0);
          iVar19 = SUB164(auVar53 ^ auVar68,4);
          iVar73 = SUB164(auVar52 ^ auVar68,4);
          if ((iVar19 < iVar73 || iVar73 == iVar19 && bVar5) != true) {
            *pdVar34 = 0.0;
          }
          if (iVar19 >= iVar73 && (iVar73 != iVar19 || !bVar5)) {
            pdVar34[lVar20] = 0.0;
          }
          auVar65._0_8_ = auVar52._0_8_ + 2;
          auVar65._8_8_ = auVar52._8_8_ + 2;
          uVar30 = uVar30 - 2;
          pdVar34 = pdVar34 + lVar20 * 2;
          auVar52 = auVar65;
        } while (uVar30 != 0);
        pdVar37[iVar13 * iVar55] = 1.0;
      }
      uVar50 = uVar50 - 1;
      lVar15 = lVar15 + -8;
      local_148 = (double *)((long)local_148 + uVar51);
      pdVar36 = (double *)((long)pdVar36 + uVar51);
      bVar5 = 1 < lVar29;
      lVar29 = lVar29 + -1;
    } while (bVar5);
  }
  auVar52 = _DAT_0011f0c0;
  auVar68 = _DAT_0011f0b0;
  auVar8 = _DAT_0011f0a0;
  if (0 < iVar4) {
    pdVar37 = V->v;
    iVar31 = V->ncols;
    lVar20 = (long)iVar31;
    uVar51 = (ulong)(iVar4 + 1U & 0xfffffffe);
    pEVar35 = pEVar10 + -1;
    auVar54._8_4_ = (int)pEVar35;
    auVar54._0_8_ = pEVar35;
    auVar54._12_4_ = (int)((ulong)pEVar35 >> 0x20);
    local_150 = (long)pEVar10 * 8;
    local_140 = (long)pEVar10 * 8;
    lVar14 = (lVar20 * 8 + 8) * (long)pEVar10;
    local_128 = (double *)((long)pdVar37 + lVar14);
    uVar30 = lVar20 * 8 ^ 0xfffffffffffffff8;
    lVar14 = (long)pdVar37 + lVar14 + -8;
    pdVar28 = pdVar37 + (long)pEVar10;
    iVar44 = 0;
    auVar54 = auVar54 ^ _DAT_0011f0b0;
    pEVar35 = pEVar10;
    do {
      local_140 = local_140 + -8;
      pdVar28 = pdVar28 + -1;
      pEVar1 = pEVar35 + -1;
      uVar16 = uVar51;
      pdVar11 = pdVar28;
      auVar53 = auVar8;
      if (((long)pEVar35 < (long)pEVar10 && (long)pEVar35 <= local_88) &&
          local_a0.v[(long)(pEVar35 + -1)] != 0.0) {
        pdVar36 = V->v;
        lVar29 = (long)V->ncols;
        lVar15 = (lVar29 + 1) * local_150;
        pdVar34 = local_128;
        pEVar47 = pEVar35;
        do {
          dVar56 = 0.0;
          pdVar18 = pdVar36;
          iVar13 = iVar44;
          do {
            dVar56 = dVar56 + *(double *)((long)pdVar18 + local_150 * lVar29 + local_140) *
                              *(double *)((long)pdVar18 + lVar15);
            pdVar18 = pdVar18 + lVar29;
            iVar13 = iVar13 + -1;
          } while (iVar13 != 0);
          dVar72 = pdVar37[(long)(pEVar1 + (long)pEVar35 * lVar20)];
          lVar21 = 0;
          iVar13 = iVar44;
          do {
            *(double *)((long)pdVar34 + lVar21) =
                 *(double *)(lVar14 + lVar21) * (-dVar56 / dVar72) +
                 *(double *)((long)pdVar34 + lVar21);
            lVar21 = lVar21 + lVar20 * 8;
            iVar13 = iVar13 + -1;
          } while (iVar13 != 0);
          pEVar47 = pEVar47 + 1;
          lVar15 = lVar15 + 8;
          pdVar34 = pdVar34 + 1;
        } while (iVar4 != (uint)pEVar47);
      }
      do {
        bVar5 = auVar54._0_4_ < SUB164(auVar53 ^ auVar68,0);
        iVar13 = auVar54._4_4_;
        iVar55 = SUB164(auVar53 ^ auVar68,4);
        if ((bool)(~(iVar13 < iVar55 || iVar55 == iVar13 && bVar5) & 1)) {
          *pdVar11 = 0.0;
        }
        if (iVar13 >= iVar55 && (iVar55 != iVar13 || !bVar5)) {
          pdVar11[lVar20] = 0.0;
        }
        auVar62._0_8_ = auVar53._0_8_ + auVar52._0_8_;
        auVar62._8_8_ = auVar53._8_8_ + auVar52._8_8_;
        uVar16 = uVar16 - 2;
        pdVar11 = pdVar11 + lVar20 * 2;
        auVar53 = auVar62;
      } while (uVar16 != 0);
      pdVar37[(iVar31 + 1) * (int)pEVar1] = 1.0;
      local_150 = local_150 + -8;
      iVar44 = iVar44 + 1;
      local_128 = (double *)((long)local_128 + uVar30);
      lVar14 = lVar14 + uVar30;
      bVar5 = 1 < (long)pEVar35;
      pEVar35 = pEVar1;
    } while (bVar5);
  }
  auVar8 = _DAT_0011f080;
  if (0 < (int)uVar7) {
    pdVar28 = W->v;
    pdVar37 = V->v;
    iVar4 = V->ncols;
    uVar51 = (ulong)(uint)local_c8.nrows;
    do {
      iVar31 = (int)pEVar26;
      uVar9 = iVar31 - 2;
      uVar50 = 0xffffffff;
      uVar30 = auVar8._0_8_;
      pEVar10 = pEVar26;
      if (uVar9 != 0xffffffff) {
        do {
          auVar68 = *(undefined1 (*) [16])(pdVar28 + (long)(pEVar10 + -2)) & auVar8;
          if ((double)((ulong)local_a0.v[(long)(pEVar10 + -2)] & uVar30) <=
              (auVar68._8_8_ + auVar68._0_8_) * 2.220446049250313e-16 + 1.6033346880071782e-291) {
            uVar50 = (int)pEVar10 - 2;
            local_a0.v[(long)(pEVar10 + -2)] = 0.0;
            break;
          }
          pEVar10 = pEVar10 + -1;
        } while (pEVar10 != (EVP_PKEY_CTX *)0x1);
      }
      uVar23 = iVar31 - 1;
      if (uVar50 == uVar9) {
        dVar56 = pdVar28[(int)uVar23];
        if (dVar56 <= 0.0) {
          pdVar28[(int)uVar23] = (double)(-(ulong)(dVar56 < -dVar56) & (ulong)-dVar56);
          pdVar11 = pdVar37 + (int)uVar23;
          uVar30 = uVar25;
          do {
            *pdVar11 = -*pdVar11;
            pdVar11 = pdVar11 + iVar4;
            uVar30 = uVar30 - 1;
          } while (uVar30 != 0);
        }
        if (iVar31 < (int)uVar7) {
          iVar44 = V->ncols;
          iVar13 = U->ncols;
          pauVar40 = (undefined1 (*) [16])(V->v + (long)(pEVar26 + -1));
          pauVar43 = (undefined1 (*) [16])(U->v + (long)(pEVar26 + -1));
          pEVar10 = pEVar26 + -1;
          do {
            dVar56 = pdVar28[(long)pEVar10];
            if (pdVar28[(long)(pEVar10 + 1)] <= dVar56) break;
            pEVar26 = pEVar10 + 1;
            pdVar28[(long)pEVar10] = pdVar28[(long)(pEVar10 + 1)];
            pdVar28[(long)pEVar26] = dVar56;
            uVar30 = uVar25;
            pauVar49 = pauVar40;
            do {
              auVar68 = *pauVar49;
              auVar58._0_8_ = auVar68._8_8_;
              auVar58._8_4_ = auVar68._0_4_;
              auVar58._12_4_ = auVar68._4_4_;
              *pauVar49 = auVar58;
              pauVar49 = (undefined1 (*) [16])(*pauVar49 + (long)iVar44 * 8);
              uVar30 = uVar30 - 1;
            } while (uVar30 != 0);
            uVar30 = uVar51;
            pauVar49 = pauVar43;
            if ((long)pEVar10 < (long)uVar45 && 0 < local_c8.nrows) {
              do {
                auVar68 = *pauVar49;
                auVar59._0_8_ = auVar68._8_8_;
                auVar59._8_4_ = auVar68._0_4_;
                auVar59._12_4_ = auVar68._4_4_;
                *pauVar49 = auVar59;
                uVar30 = uVar30 - 1;
                pauVar49 = (undefined1 (*) [16])(*pauVar49 + (long)iVar13 * 8);
              } while (uVar30 != 0);
            }
            pauVar40 = (undefined1 (*) [16])(*pauVar40 + 8);
            pauVar43 = (undefined1 (*) [16])(*pauVar43 + 8);
            pEVar10 = pEVar26;
          } while (pEVar26 != (EVP_PKEY_CTX *)(long)iVar12);
        }
        pEVar26 = (EVP_PKEY_CTX *)(ulong)(iVar31 - 1);
      }
      else {
        pEVar10 = (EVP_PKEY_CTX *)(ulong)uVar23;
        if ((int)uVar50 < (int)uVar23) {
          pEVar10 = pEVar26 + -1;
          do {
            dVar56 = 0.0;
            if ((EVP_PKEY_CTX *)(long)(int)(uVar50 + 1) != pEVar10) {
              dVar56 = (double)((ulong)local_a0.v[(long)(pEVar10 + -1)] & uVar30);
            }
            if ((double)((ulong)pdVar28[(long)pEVar10] & uVar30) <=
                ((double)((ulong)local_a0.v[(long)pEVar10] & uVar30) + dVar56) *
                2.220446049250313e-16 + 1.6033346880071782e-291) {
              pdVar28[(long)pEVar10] = 0.0;
              break;
            }
            pEVar10 = pEVar10 + -1;
          } while ((long)(int)uVar50 < (long)pEVar10);
        }
        uVar38 = (uint)pEVar10;
        if (uVar38 == uVar50) {
          lVar14 = (long)(int)uVar50;
          dVar63 = ABS(pdVar28[(int)uVar23]);
          dVar72 = ABS(pdVar28[(int)uVar9]);
          auVar68._8_8_ = local_a0.v[(int)uVar9];
          auVar68._0_8_ = pdVar28[(int)uVar23];
          dVar56 = ABS(local_a0.v[(int)uVar9]);
          if (dVar72 <= dVar63) {
            dVar72 = dVar63;
          }
          dVar63 = ABS(pdVar28[lVar14 + 1]);
          if (dVar56 <= dVar72) {
            dVar56 = dVar72;
          }
          dVar72 = ABS(local_a0.v[lVar14 + 1]);
          if (dVar63 <= dVar56) {
            dVar63 = dVar56;
          }
          if (dVar72 <= dVar63) {
            dVar72 = dVar63;
          }
          dVar71 = pdVar28[(int)uVar9] / dVar72;
          auVar6._8_8_ = dVar72;
          auVar6._0_8_ = dVar72;
          auVar68 = divpd(auVar68,auVar6);
          dVar56 = auVar68._0_8_;
          dVar63 = auVar68._8_8_;
          dVar74 = (dVar63 * dVar63 + (dVar71 - dVar56) * (dVar71 + dVar56)) * 0.5;
          dVar71 = dVar56 * dVar63 * dVar56 * dVar63;
          dVar63 = 0.0;
          if ((((dVar71 != 0.0) || (NAN(dVar71))) || (dVar74 != 0.0)) || (NAN(dVar74))) {
            dVar63 = SQRT(dVar74 * dVar74 + dVar71);
            dVar63 = dVar71 / ((double)((ulong)-dVar63 & -(ulong)(dVar74 < 0.0) |
                                       ~-(ulong)(dVar74 < 0.0) & (ulong)dVar63) + dVar74);
          }
          lVar20 = lVar14 + 1;
          dVar71 = pdVar28[lVar14 + 1] / dVar72;
          dVar63 = (dVar71 - dVar56) * (dVar71 + dVar56) + dVar63;
          if ((int)lVar20 < (int)uVar23) {
            auVar66._0_8_ = dVar71 * (local_a0.v[lVar14 + 1] / dVar72);
            iVar31 = V->ncols;
            iVar44 = U->ncols;
            auVar66._8_8_ = dVar63;
            pdVar11 = V->v + lVar14;
            pauVar40 = (undefined1 (*) [16])(U->v + lVar14);
            lVar14 = lVar20;
            do {
              pauVar40 = (undefined1 (*) [16])((long)*pauVar40 + 8);
              pdVar11 = pdVar11 + 1;
              dVar56 = auVar66._8_8_;
              if ((dVar56 != 0.0) || (NAN(dVar56))) {
                dVar72 = auVar66._0_8_ / dVar56;
                dVar56 = SQRT(dVar72 * dVar72 + 1.0) * (double)((ulong)dVar56 & uVar30);
              }
              else {
                dVar56 = (double)((ulong)auVar66._0_8_ & uVar30);
              }
              if (lVar14 != lVar20) {
                local_a0.v[lVar14 + -1] = dVar56;
              }
              auVar69._8_8_ = dVar56;
              auVar69._0_8_ = dVar56;
              auVar68 = divpd(auVar66,auVar69);
              dVar56 = auVar68._0_8_;
              dVar72 = auVar68._8_8_;
              dVar63 = dVar72 * pdVar28[lVar14] + dVar56 * local_a0.v[lVar14];
              local_a0.v[lVar14] = local_a0.v[lVar14] * dVar72 - pdVar28[lVar14] * dVar56;
              lVar15 = lVar14 + 1;
              auVar70._0_8_ = dVar56 * pdVar28[lVar14 + 1];
              pdVar28[lVar14 + 1] = dVar72 * pdVar28[lVar14 + 1];
              uVar16 = uVar25;
              pdVar36 = pdVar11;
              do {
                dVar71 = *pdVar36;
                *pdVar36 = dVar71 * dVar72 + pdVar36[1] * dVar56;
                pdVar36[1] = dVar71 * -dVar56 + pdVar36[1] * dVar72;
                pdVar36 = pdVar36 + iVar31;
                uVar16 = uVar16 - 1;
              } while (uVar16 != 0);
              if ((dVar63 != 0.0) || (NAN(dVar63))) {
                dVar56 = SQRT((auVar70._0_8_ / dVar63) * (auVar70._0_8_ / dVar63) + 1.0) *
                         (double)((ulong)dVar63 & uVar30);
              }
              else {
                dVar56 = (double)((ulong)auVar70._0_8_ & uVar30);
              }
              auVar70._8_8_ = dVar63;
              auVar60._8_8_ = dVar56;
              auVar60._0_8_ = dVar56;
              auVar68 = divpd(auVar70,auVar60);
              pdVar28[lVar14] = dVar56;
              dVar56 = local_a0.v[lVar14];
              dVar72 = pdVar28[lVar15];
              dVar74 = auVar68._0_8_;
              dVar63 = auVar68._8_8_;
              pdVar28[lVar15] = dVar63 * dVar72 - dVar74 * dVar56;
              dVar71 = local_a0.v[lVar15];
              local_a0.v[lVar15] = dVar63 * dVar71;
              if (lVar14 < (long)uVar45 && 0 < local_c8.nrows) {
                uVar16 = uVar51;
                pauVar43 = pauVar40;
                do {
                  auVar61._0_8_ =
                       *(double *)*pauVar43 * dVar63 + *(double *)((long)*pauVar43 + 8) * dVar74;
                  auVar61._8_8_ =
                       *(double *)*pauVar43 * -dVar74 + *(double *)((long)*pauVar43 + 8) * dVar63;
                  *pauVar43 = auVar61;
                  pauVar43 = (undefined1 (*) [16])((long)*pauVar43 + (long)iVar44 * 8);
                  uVar16 = uVar16 - 1;
                } while (uVar16 != 0);
              }
              dVar63 = dVar63 * dVar56 + dVar72 * dVar74;
              auVar66._0_8_ = dVar71 * dVar74;
              auVar66._8_8_ = dVar63;
              lVar14 = lVar15;
            } while (lVar15 != (int)uVar23);
          }
          local_a0.v[(int)uVar9] = dVar63;
        }
        else {
          uVar24 = uVar38;
          if (uVar38 == uVar23) {
            uVar24 = uVar50;
          }
          iVar44 = uVar24 + 1;
          if (uVar38 == uVar23) {
            dVar56 = local_a0.v[(int)uVar9];
            local_a0.v[(int)uVar9] = 0.0;
            if ((int)uVar50 < (int)uVar9) {
              pdVar11 = V->v;
              iVar31 = V->ncols;
              lVar14 = (long)pEVar26 * 8 + -0x10;
              pEVar10 = pEVar26 + -2;
              do {
                dVar72 = pdVar28[(long)pEVar10];
                if ((dVar72 != 0.0) || (NAN(dVar72))) {
                  dVar63 = SQRT((dVar56 / dVar72) * (dVar56 / dVar72) + 1.0) *
                           (double)((ulong)dVar72 & uVar30);
                }
                else {
                  dVar63 = (double)((ulong)dVar56 & uVar30);
                }
                dVar72 = dVar72 / dVar63;
                dVar71 = dVar56 / dVar63;
                pdVar28[(long)pEVar10] = dVar63;
                if (pEVar10 != (EVP_PKEY_CTX *)(long)iVar44) {
                  dVar56 = -dVar71 * local_a0.v[(long)(pEVar10 + -1)];
                  local_a0.v[(long)(pEVar10 + -1)] = local_a0.v[(long)(pEVar10 + -1)] * dVar72;
                }
                uVar16 = uVar25;
                pdVar36 = pdVar11;
                do {
                  dVar63 = *(double *)((long)pdVar36 + lVar14);
                  dVar74 = pdVar36[(int)uVar23];
                  pdVar36[(int)uVar23] = dVar63 * -dVar71 + dVar74 * dVar72;
                  *(double *)((long)pdVar36 + lVar14) = dVar72 * dVar63 + dVar71 * dVar74;
                  pdVar36 = pdVar36 + iVar31;
                  uVar16 = uVar16 - 1;
                } while (uVar16 != 0);
                pEVar10 = pEVar10 + -1;
                lVar14 = lVar14 + -8;
              } while ((long)(int)uVar50 < (long)pEVar10);
            }
          }
          else {
            dVar56 = local_a0.v[(int)uVar38];
            local_a0.v[(int)uVar38] = 0.0;
            if (iVar44 < iVar31) {
              pdVar11 = U->v;
              iVar13 = U->ncols;
              lVar20 = (long)iVar44;
              lVar14 = lVar20 * 8;
              do {
                dVar72 = pdVar28[lVar20];
                if ((dVar72 != 0.0) || (NAN(dVar72))) {
                  dVar63 = SQRT((dVar56 / dVar72) * (dVar56 / dVar72) + 1.0) *
                           (double)((ulong)dVar72 & uVar30);
                }
                else {
                  dVar63 = (double)((ulong)dVar56 & uVar30);
                }
                dVar72 = dVar72 / dVar63;
                pdVar28[lVar20] = dVar63;
                dVar74 = -(dVar56 / dVar63);
                dVar71 = local_a0.v[lVar20];
                local_a0.v[lVar20] = dVar72 * dVar71;
                uVar16 = uVar51;
                pdVar36 = pdVar11;
                if (0 < iVar48) {
                  do {
                    dVar2 = *(double *)((long)pdVar36 + lVar14);
                    dVar3 = pdVar36[(int)uVar38];
                    pdVar36[(int)uVar38] = dVar2 * dVar74 + dVar3 * dVar72;
                    *(double *)((long)pdVar36 + lVar14) = dVar72 * dVar2 + (dVar56 / dVar63) * dVar3
                    ;
                    pdVar36 = pdVar36 + iVar13;
                    uVar16 = uVar16 - 1;
                  } while (uVar16 != 0);
                }
                dVar56 = dVar71 * dVar74;
                lVar20 = lVar20 + 1;
                lVar14 = lVar14 + 8;
              } while (iVar31 != (int)lVar20);
            }
          }
        }
      }
    } while (0 < (int)pEVar26);
  }
  if (local_80.v != (double *)0x0) {
    operator_delete__(local_80.v);
  }
  if (local_a0.v != (double *)0x0) {
    operator_delete__(local_a0.v);
  }
  if (local_c8.v != (double *)0x0) {
    operator_delete__(local_c8.v);
  }
  return;
}

Assistant:

void svd(const Matrixd &a, Matrixd &U, Vectord &W, Matrixd &V, bool thin)
{
  const bool wantu=true;
  const bool wantv=true;

  Matrixd A(a);

  const int m=A.rows();
  const int n=A.cols();
  const int ncu=thin?std::min(m, n):m;

  U.init(m, ncu); U=0;
  W.init(std::min(m+1, n));
  V.init(n, n); V=0;

  Vectord e(n);
  Vectord work(m);

  // Reduce A to bidiagonal form, storing the diagonal elements
  // in W and the super-diagonal elements in e.

  int nct=std::min(m-1, n);
  int nrt=std::max(0, std::min(n-2, m));
  int lu=std::max(nct, nrt);

  for (int k=0; k<lu; k++)
  {
    if (k < nct)
    {
      // Compute the transformation for the k-th column and
      // place the k-th diagonal in W[k].
      // Compute 2-norm of k-th column without under/overflow.

      W[k]=0;

      for (int i=k; i<m; i++)
      {
        W[k]=hypot(W[k], A(i, k));
      }

      if (W[k] != 0.0)
      {
        if (A(k, k) < 0.0)
        {
          W[k]=-W[k];
        }

        for (int i=k; i<m; i++)
        {
          A(i, k)/=W[k];
        }

        A(k, k)+=1.0;
      }

      W[k]=-W[k];
    }

    for (int j=k+1; j<n; j++)
    {
      if ((k < nct) & (W[k] != 0.0))
      {
        // Apply the transformation.

        double t=0;

        for (int i=k; i<m; i++)
        {
          t+=A(i, k)*A(i, j);
        }

        t=-t/A(k, k);

        for (int i=k; i<m; i++)
        {
          A(i, j)+=t*A(i, k);
        }
      }

      // Place the k-th row of A into e for the
      // subsequent calculation of the row transformation.

      e[j]=A(k, j);
    }

    if (wantu & (k < nct))
    {
      // Place the transformation in U for subsequent back
      // multiplication.

      for (int i=k; i<m; i++)
      {
        U(i, k)=A(i, k);
      }
    }

    if (k < nrt)
    {
      // Compute the k-th row transformation and place the
      // k-th super-diagonal in e[k].
      // Compute 2-norm without under/overflow.

      e[k]=0;

      for (int i=k+1; i<n; i++)
      {
        e[k]=hypot(e[k], e[i]);
      }

      if (e[k] != 0.0)
      {
        if (e[k+1] < 0.0)
        {
          e[k]=-e[k];
        }

        for (int i=k+1; i<n; i++)
        {
          e[i]/=e[k];
        }

        e[k+1]+=1.0;
      }

      e[k]=-e[k];

      if ((k+1 < m) & (e[k] != 0.0))
      {
        // Apply the transformation.

        for (int i=k+1; i<m; i++)
        {
          work[i]=0.0;
        }

        for (int j=k+1; j<n; j++)
        {
          for (int i=k+1; i<m; i++)
          {
            work[i]+=e[j]*A(i, j);
          }
        }

        for (int j=k+1; j<n; j++)
        {
          double t=-e[j]/e[k+1];

          for (int i=k+1; i<m; i++)
          {
            A(i, j)+=t*work[i];
          }
        }
      }

      if (wantv)
      {
        // Place the transformation in V for subsequent
        // back multiplication.

        for (int i=k+1; i<n; i++)
        {
          V(i, k)=e[i];
        }
      }
    }
  }

  // Set up the final bidiagonal matrix or order p.

  int p=std::min(n, m+1);

  if (nct < n)
  {
    W[nct]=A(nct, nct);
  }

  if (m < p)
  {
    W[p-1]=0.0;
  }

  if (nrt+1 < p)
  {
    e[nrt]=A(nrt, p-1);
  }

  e[p-1]=0.0;

  // If required, generate U.

  if (wantu)
  {
    for (int j=nct; j<ncu; j++)
    {
      for (int i=0; i<m; i++)
      {
        U(i, j)=0.0;
      }

      U(j, j)=1.0;
    }

    for (int k=nct-1; k>=0; k--)
    {
      if (W[k] != 0.0)
      {
        for (int j=k+1; j<ncu; j++)
        {
          double t=0;

          for (int i=k; i<m; i++)
          {
            t+=U(i, k)*U(i, j);
          }

          t=-t/U(k, k);

          for (int i=k; i<m; i++)
          {
            U(i, j)+=t*U(i, k);
          }
        }

        for (int i=k; i<m; i++)
        {
          U(i, k)=-U(i, k);
        }

        U(k, k)+=1.0;

        for (int i=0; i<k-1; i++)
        {
          U(i, k)=0.0;
        }
      }
      else
      {
        for (int i=0; i<m; i++)
        {
          U(i, k)=0.0;
        }

        U(k, k)=1.0;
      }
    }
  }

  // If required, generate V.

  if (wantv)
  {
    for (int k=n-1; k>=0; k--)
    {
      if ((k < nrt) & (e[k] != 0.0))
      {
        for (int j=k+1; j<n; j++)
        {
          double t=0;

          for (int i=k+1; i<n; i++)
          {
            t+=V(i, k)*V(i, j);
          }

          t=-t/V(k+1, k);

          for (int i=k+1; i<n; i++)
          {
            V(i, j)+=t*V(i, k);
          }
        }
      }

      for (int i=0; i<n; i++)
      {
        V(i, k)=0.0;
      }

      V(k, k)=1.0;
    }
  }

  // Main iteration loop for the singular values.

  int pp=p-1;
  int iter=0;
  double eps=pow(2.0,-52.0);
  double tiny=pow(2.0,-966.0);

  while (p > 0)
  {
    int k, kase;

    // Here is where a test for too many iterations would go.

    // This section of the program inspects for
    // negligible elements in the s and e arrays. On
    // completion the variables kase and k are set as follows.

    // kase = 1     if s(p) and e[k-1] are negligible and k<p
    // kase = 2     if s(k) is negligible and k<p
    // kase = 3     if e[k-1] is negligible, k<p, and
    //              s(k), ..., s(p) are not negligible (qr step).
    // kase = 4     if e(p-1) is negligible (convergence).

    for (k=p-2; k>=-1; k--)
    {
      if (k == -1)
      {
        break;
      }

      if (std::abs(e[k]) <= tiny+eps*(std::abs(W[k])+std::abs(W[k+1])))
      {
        e[k]=0.0;
        break;
      }
    }

    if (k == p-2)
    {
      kase=4;
    }
    else
    {
      int ks;

      for (ks=p-1; ks>=k; ks--)
      {
        if (ks == k)
        {
          break;
        }

        double t=(ks != p ? std::abs(e[ks]) : 0.) +
                 (ks != k+1 ? std::abs(e[ks-1]) : 0.);

        if (std::abs(W[ks]) <= tiny+eps*t)
        {
          W[ks]=0.0;
          break;
        }
      }

      if (ks == k)
      {
        kase=3;
      }
      else if (ks == p-1)
      {
        kase=1;
      }
      else
      {
        kase=2;
        k=ks;
      }
    }

    k++;

    // Perform the task indicated by kase.

    switch (kase)
    {

        // Deflate negligible s(p).

      case 1:
        {
          double f=e[p-2];
          e[p-2]=0.0;

          for (int j=p-2; j>=k; j--)
          {
            double t=hypot(W[j],f);
            double cs=W[j]/t;
            double sn=f/t;
            W[j]=t;

            if (j != k)
            {
              f=-sn*e[j-1];
              e[j-1]=cs*e[j-1];
            }

            if (wantv)
            {
              for (int i=0; i<n; i++)
              {
                t=cs*V(i, j)+sn*V(i, p-1);
                V(i, p-1)=-sn*V(i, j)+cs*V(i, p-1);
                V(i, j)=t;
              }
            }
          }
        }
        break;

        // Split at negligible s(k).

      case 2:
        {
          double f=e[k-1];
          e[k-1]=0.0;

          for (int j=k; j<p; j++)
          {
            double t=hypot(W[j],f);
            double cs=W[j]/t;
            double sn=f/t;
            W[j]=t;
            f=-sn*e[j];
            e[j]=cs*e[j];

            if (wantu)
            {
              for (int i=0; i<m; i++)
              {
                t=cs*U(i, j)+sn*U(i, k-1);
                U(i, k-1)=-sn*U(i, j)+cs*U(i, k-1);
                U(i, j)=t;
              }
            }
          }
        }
        break;

        // Perform one qr step.

      case 3:
        {

          // Calculate the shift.

          double scale=std::max(std::max(std::max(std::max(std::abs(W[p-1]), std::abs(W[p-2])),
                                                  std::abs(e[p-2])), std::abs(W[k])), std::abs(e[k]));
          double sp=W[p-1]/scale;
          double spm1=W[p-2]/scale;
          double epm1=e[p-2]/scale;
          double sk=W[k]/scale;
          double ek=e[k]/scale;
          double b=((spm1+sp)*(spm1-sp)+epm1*epm1)/2.0;
          double c=(sp*epm1)*(sp*epm1);
          double shift=0.0;

          if ((b != 0.0) | (c != 0.0))
          {
            shift=sqrt(b*b + c);

            if (b < 0.0)
            {
              shift=-shift;
            }

            shift=c/(b + shift);
          }

          double f=(sk + sp)*(sk - sp) + shift;
          double g=sk*ek;

          // Chase zeros.

          for (int j=k; j<p-1; j++)
          {
            double t=hypot(f, g);
            double cs=f/t;
            double sn=g/t;

            if (j != k)
            {
              e[j-1]=t;
            }

            f=cs*W[j]+sn*e[j];
            e[j]=cs*e[j]-sn*W[j];
            g=sn*W[j+1];
            W[j+1]=cs*W[j+1];

            if (wantv)
            {
              for (int i=0; i<n; i++)
              {
                t=cs*V(i, j)+sn*V(i, j+1);
                V(i, j+1)=-sn*V(i, j)+cs*V(i, j+1);
                V(i, j)=t;
              }
            }

            t=hypot(f,g);
            cs=f/t;
            sn=g/t;
            W[j]=t;
            f=cs*e[j]+sn*W[j+1];
            W[j+1]=-sn*e[j]+cs*W[j+1];
            g=sn*e[j+1];
            e[j+1]=cs*e[j+1];

            if (wantu && (j < m-1))
            {
              for (int i=0; i<m; i++)
              {
                t=cs*U(i, j)+sn*U(i, j+1);
                U(i, j+1)=-sn*U(i, j)+cs*U(i, j+1);
                U(i, j)=t;
              }
            }
          }

          e[p-2]=f;
          iter++;
        }
        break;

        // Convergence.

      case 4:
        {

          // Make the singular values positive.

          if (W[k] <= 0.0)
          {
            W[k]=(W[k] < 0.0 ? -W[k] : 0.0);

            if (wantv)
            {
              for (int i=0; i<n; i++)
              {
                V(i, k)=-V(i, k);
              }
            }
          }

          // Order the singular values.

          while (k < pp)
          {
            if (W[k] >= W[k+1])
            {
              break;
            }

            double t=W[k];
            W[k]=W[k+1];
            W[k+1]=t;

            if (wantv && (k < n-1))
            {
              for (int i=0; i<n; i++)
              {
                t=V(i, k+1);
                V(i, k+1)=V(i, k);
                V(i, k)=t;
              }
            }

            if (wantu && (k < m-1))
            {
              for (int i=0; i<m; i++)
              {
                t=U(i, k+1);
                U(i, k+1)=U(i, k);
                U(i, k)=t;
              }
            }

            k++;
          }

          iter=0;
          p--;
        }
        break;
    }
  }
}